

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  uint *puVar1;
  float *scanline;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  stbtt_uint8 sVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  stbtt_uint8 *data;
  undefined4 uVar15;
  stbtt_packedchar *psVar13;
  undefined4 uVar16;
  ImFont *font;
  stbtt_packedchar *psVar14;
  stbrp_node *psVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ImFontBuildSrcData *pIVar22;
  stbtt_packedchar *psVar23;
  unsigned_short uVar24;
  unsigned_short uVar25;
  unsigned_short uVar26;
  unsigned_short uVar27;
  int output_i;
  stbtt_uint32 sVar28;
  stbtt_uint32 sVar29;
  stbtt_uint32 sVar30;
  stbtt_uint32 sVar31;
  stbtt_uint32 sVar32;
  stbtt_uint32 sVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  undefined4 extraout_var;
  ImFontBuildDstData *pIVar38;
  ImFontConfig *pIVar39;
  stbrp_context *context;
  uchar *puVar40;
  ulong uVar41;
  void *ptr;
  stbtt__edge *p;
  float *scanline_00;
  undefined8 *puVar42;
  stbtt__active_edge *psVar43;
  stbtt_uint32 *psVar44;
  ushort uVar45;
  ushort uVar46;
  int iVar47;
  ImWchar *src_range;
  ImWchar *pIVar48;
  stbtt__active_edge *psVar49;
  long lVar50;
  float *pfVar51;
  int x;
  ImU32 mask;
  uint uVar52;
  uint uVar53;
  ulong uVar54;
  ulong uVar55;
  uchar *puVar56;
  stbrp_rect *psVar57;
  int *piVar58;
  uint codepoint;
  stbtt__edge *psVar59;
  ulong uVar60;
  stbtt__edge *psVar61;
  long lVar62;
  uchar *puVar63;
  byte *pbVar64;
  int iVar65;
  ulong uVar66;
  int iVar67;
  int src_i_1;
  stbtt__active_edge *psVar68;
  byte *pbVar69;
  int iVar70;
  stbtt_uint32 encoding_record;
  uint uVar71;
  long lVar72;
  ImFontBuildSrcData *pIVar73;
  uchar *puVar74;
  int dst_i;
  long lVar75;
  stbtt__active_edge *psVar76;
  bool bVar77;
  float sum;
  float fVar78;
  float fVar79;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar81;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  undefined1 auVar80 [16];
  undefined1 extraout_var_00 [12];
  float fVar82;
  float fVar83;
  undefined1 auVar84 [16];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float in_XMM3_Da;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  uint in_XMM4_Db;
  uint in_XMM4_Dc;
  uint in_XMM4_Dd;
  float fVar93;
  float fVar94;
  float fVar95;
  stbtt__buf sVar96;
  float y0_2;
  undefined1 auStack_4a4 [12];
  int y1;
  ulong local_478;
  stbtt_uint32 charstrings;
  undefined8 local_468;
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [28];
  uint local_43c;
  ImVector<ImFontBuildSrcData> src_tmp_array;
  stbrp_node *local_418;
  stbtt__point *local_408;
  stbtt_uint32 fdarrayoff;
  undefined4 uStack_3fc;
  float local_3f8;
  int local_3f4;
  int local_3f0;
  float local_3ec;
  ImVector<stbrp_rect> buf_rects;
  float local_3c4;
  float local_3c0;
  int y0_1;
  int x0_1;
  ImVector<ImFontBuildDstData> dst_tmp_array;
  ImVector<stbtt_packedchar> buf_packedchars;
  undefined8 *local_380;
  int iy0;
  long local_320;
  long local_318;
  stbrp_rect *local_310;
  ulong local_308;
  ulong local_300;
  long local_2f8;
  ulong local_2f0;
  float local_2e8;
  undefined4 uStack_2e4;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  stbrp_context *local_2d8;
  ImFontConfig *local_2d0;
  long local_2c8;
  uchar *local_2c0;
  long local_2b8;
  size_t local_2b0;
  size_t local_2a8;
  stbtt_packedchar *local_2a0;
  stbtt__edge *local_298;
  long local_290;
  uchar *local_288;
  int local_280;
  int x1_1;
  float local_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  float local_268;
  uint uStack_264;
  uint uStack_260;
  uint uStack_25c;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  float local_248;
  uint uStack_244;
  uint uStack_240;
  uint uStack_23c;
  int x0;
  undefined4 uStack_234;
  uint uStack_230;
  uint uStack_22c;
  
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  src_tmp_array.Size = 0;
  src_tmp_array.Capacity = 0;
  src_tmp_array.Data = (ImFontBuildSrcData *)0x0;
  dst_tmp_array.Size = 0;
  dst_tmp_array.Capacity = 0;
  dst_tmp_array.Data = (ImFontBuildDstData *)0x0;
  ImVector<ImFontBuildSrcData>::resize(&src_tmp_array,(atlas->ConfigData).Size);
  ImVector<ImFontBuildDstData>::resize(&dst_tmp_array,(atlas->Fonts).Size);
  lVar72 = 0;
  memset(src_tmp_array.Data,0,(long)src_tmp_array.Size * 0x110);
  memset(dst_tmp_array.Data,0,(long)dst_tmp_array.Size << 5);
  while( true ) {
    local_2c8 = (long)(atlas->ConfigData).Size;
    local_320 = lVar72;
    if (local_2c8 <= lVar72) break;
    pIVar73 = src_tmp_array.Data;
    local_468 = (atlas->ConfigData).Data + lVar72;
    src_tmp_array.Data[lVar72].DstIndex = -1;
    lVar37 = 0;
    lVar75 = -1;
    while ((iVar70 = (int)lVar75, lVar37 < (atlas->Fonts).Size && (iVar70 == -1))) {
      lVar75 = -1;
      if (local_468->DstFont == (atlas->Fonts).Data[lVar37]) {
        src_tmp_array.Data[lVar72].DstIndex = (int)lVar37;
        lVar75 = lVar37;
      }
      lVar37 = lVar37 + 1;
    }
    if (iVar70 == -1) goto LAB_001e0a3f;
    data = (stbtt_uint8 *)local_468->FontData;
    iVar34 = local_468->FontNo;
    sVar6 = *data;
    if (sVar6 == '\0') {
      sVar33 = 0xffffffff;
      if (((data[1] != '\x01') || (data[2] != '\0')) || (data[3] != '\0')) goto LAB_001de298;
LAB_001de28d:
      sVar33 = -(uint)(iVar34 != 0);
    }
    else {
      sVar33 = 0xffffffff;
      if (sVar6 == 't') {
        sVar6 = data[1];
        if (sVar6 == 'r') {
          if (data[2] == 'u') {
            bVar77 = data[3] == 'e';
            goto LAB_001de288;
          }
        }
        else if (sVar6 == 't') {
          if ((((data[2] == 'c') && (data[3] == 'f')) &&
              ((sVar28 = ttULONG(data + 4), sVar28 == 0x20000 || (sVar28 == 0x10000)))) &&
             (uVar71 = *(uint *)(data + 8),
             iVar34 < (int)(uVar71 >> 0x18 | (uVar71 & 0xff0000) >> 8 | (uVar71 & 0xff00) << 8 |
                           uVar71 << 0x18))) {
            sVar33 = ttULONG(data + (long)iVar34 * 4 + 0xc);
          }
        }
        else if ((sVar6 == 'y') && (data[2] == 'p')) {
          bVar77 = data[3] == '1';
          goto LAB_001de288;
        }
      }
      else if (sVar6 == 'O') {
        if ((data[1] == 'T') && (data[2] == 'T')) {
          bVar77 = data[3] == 'O';
          goto LAB_001de288;
        }
      }
      else if (((sVar6 == '1') && (data[1] == '\0')) && (data[2] == '\0')) {
        bVar77 = data[3] == '\0';
LAB_001de288:
        if (bVar77) goto LAB_001de28d;
      }
    }
LAB_001de298:
    pIVar73[lVar72].FontInfo.data = data;
    pIVar73[lVar72].FontInfo.fontstart = sVar33;
    pIVar22 = pIVar73 + lVar72;
    (pIVar22->FontInfo).cff.data = (uchar *)0x0;
    (pIVar22->FontInfo).cff.cursor = 0;
    (pIVar22->FontInfo).cff.size = 0;
    sVar28 = stbtt__find_table(data,sVar33,"cmap");
    auVar84 = local_458._0_16_;
    local_458._4_4_ = extraout_var;
    local_458._0_4_ = sVar28;
    local_458._8_8_ = auVar84._8_8_;
    sVar28 = stbtt__find_table(data,sVar33,"loca");
    pIVar73[lVar72].FontInfo.loca = sVar28;
    sVar29 = stbtt__find_table(data,sVar33,"head");
    y0_2 = (float)sVar29;
    pIVar73[lVar72].FontInfo.head = sVar29;
    sVar30 = stbtt__find_table(data,sVar33,"glyf");
    local_478 = CONCAT44(local_478._4_4_,sVar30);
    pIVar73[lVar72].FontInfo.glyf = sVar30;
    sVar30 = stbtt__find_table(data,sVar33,"hhea");
    pIVar73[lVar72].FontInfo.hhea = sVar30;
    sVar31 = stbtt__find_table(data,sVar33,"hmtx");
    pIVar73[lVar72].FontInfo.hmtx = sVar31;
    sVar32 = stbtt__find_table(data,sVar33,"kern");
    pIVar73[lVar72].FontInfo.kern = sVar32;
    sVar32 = stbtt__find_table(data,sVar33,"GPOS");
    pIVar73[lVar72].FontInfo.gpos = sVar32;
    if ((((float)local_458._0_4_ == 0.0) || (sVar29 == 0)) || ((sVar30 == 0 || (sVar31 == 0))))
    goto LAB_001e0a3f;
    if ((float)local_478 == 0.0) {
      _charstrings = (stbtt__active_edge *)((ulong)_charstrings & 0xffffffff00000000);
      fdarrayoff = 0;
      buf_packedchars.Size = 2;
      y1 = 0;
      sVar28 = stbtt__find_table(data,sVar33,"CFF ");
      if (sVar28 == 0) goto LAB_001e0a3f;
      pIVar22 = pIVar73 + lVar72;
      (pIVar22->FontInfo).fdselect.data = (uchar *)0x0;
      (pIVar22->FontInfo).fdselect.cursor = 0;
      (pIVar22->FontInfo).fdselect.size = 0;
      pIVar22 = pIVar73 + lVar72;
      (pIVar22->FontInfo).fontdicts.data = (uchar *)0x0;
      (pIVar22->FontInfo).fontdicts.cursor = 0;
      (pIVar22->FontInfo).fontdicts.size = 0;
      pIVar73[lVar72].FontInfo.cff.data = data + sVar28;
      pIVar73[lVar72].FontInfo.cff.cursor = 0;
      pIVar73[lVar72].FontInfo.cff.size = 0x20000000;
      puVar40 = pIVar73[lVar72].FontInfo.cff.data;
      uVar18 = pIVar73[lVar72].FontInfo.cff.cursor;
      uVar19 = pIVar73[lVar72].FontInfo.cff.size;
      x0 = (int)puVar40;
      uStack_234 = (undefined4)((ulong)puVar40 >> 0x20);
      uVar71 = uVar18 + 2;
      if ((int)uVar19 < (int)(uVar18 + 2)) {
        uVar71 = uVar19;
      }
      if ((int)uVar18 < -2) {
        uVar71 = uVar19;
      }
      uStack_230 = 0;
      if ((int)uVar71 < (int)uVar19) {
        uStack_230 = (uint)puVar40[(int)uVar71];
      }
      if ((int)uVar19 < (int)uStack_230) {
        uStack_230 = uVar19;
      }
      uStack_22c = uVar19;
      stbtt__cff_get_index((stbtt__buf *)&x0);
      sVar96 = stbtt__cff_get_index((stbtt__buf *)&x0);
      buf_rects = (ImVector<stbrp_rect>)stbtt__cff_index_get(sVar96,0);
      stbtt__cff_get_index((stbtt__buf *)&x0);
      sVar96 = stbtt__cff_get_index((stbtt__buf *)&x0);
      pIVar73[lVar72].FontInfo.gsubrs = sVar96;
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x11,1,&charstrings);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x106,1,(stbtt_uint32 *)&buf_packedchars);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x124,1,&fdarrayoff);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x125,1,(stbtt_uint32 *)&y1);
      uVar71 = uStack_22c;
      sVar96.data._4_4_ = uStack_234;
      sVar96.data._0_4_ = x0;
      sVar96.cursor = uStack_230;
      sVar96.size = uStack_22c;
      sVar96 = stbtt__get_subrs(sVar96,(stbtt__buf)buf_rects);
      iVar34 = y1;
      pIVar73[lVar72].FontInfo.subrs = sVar96;
      if ((buf_packedchars.Size != 2) || (sVar28 = charstrings, charstrings == 0))
      goto LAB_001e0a3f;
      if (fdarrayoff != 0) {
        if (y1 == 0) goto LAB_001e0a3f;
        uStack_230 = fdarrayoff;
        if ((int)uVar71 < (int)fdarrayoff) {
          uStack_230 = uVar71;
        }
        if ((int)fdarrayoff < 0) {
          uStack_230 = uVar71;
        }
        sVar96 = stbtt__cff_get_index((stbtt__buf *)&x0);
        uVar71 = uStack_22c;
        pIVar73[lVar72].FontInfo.fontdicts = sVar96;
        sVar96 = stbtt__buf_range((stbtt__buf *)&x0,iVar34,uStack_22c - iVar34);
        pIVar73[lVar72].FontInfo.fdselect = sVar96;
      }
      uStack_230 = sVar28;
      if ((int)uVar71 < (int)sVar28) {
        uStack_230 = uVar71;
      }
      if ((int)sVar28 < 0) {
        uStack_230 = uVar71;
      }
      sVar96 = stbtt__cff_get_index((stbtt__buf *)&x0);
      pIVar73[lVar72].FontInfo.charstrings = sVar96;
    }
    else if (sVar28 == 0) goto LAB_001e0a3f;
    sVar33 = stbtt__find_table(data,sVar33,"maxp");
    if (sVar33 == 0) {
      uVar71 = 0xffff;
    }
    else {
      uVar71 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar33 + 4) << 8 |
                             *(ushort *)(data + (ulong)sVar33 + 4) >> 8);
    }
    pIVar73[lVar72].FontInfo.numGlyphs = uVar71;
    pIVar73[lVar72].FontInfo.svg = -1;
    iVar35 = local_458._0_4_;
    uVar45 = *(ushort *)(data + (local_458._0_8_ & 0xffffffff) + 2);
    pIVar73[lVar72].FontInfo.index_map = 0;
    uVar54 = (ulong)(ushort)(uVar45 << 8 | uVar45 >> 8);
    uVar71 = iVar35 + 4;
    iVar34 = 0;
    while (bVar77 = uVar54 != 0, uVar54 = uVar54 - 1, bVar77) {
      uVar45 = *(ushort *)(data + uVar71) << 8 | *(ushort *)(data + uVar71) >> 8;
      if ((uVar45 == 0) ||
         ((uVar45 == 3 &&
          ((uVar45 = *(ushort *)(data + (ulong)uVar71 + 2) << 8 |
                     *(ushort *)(data + (ulong)uVar71 + 2) >> 8, uVar45 == 10 || (uVar45 == 1))))))
      {
        sVar33 = ttULONG(data + (ulong)uVar71 + 4);
        iVar34 = sVar33 + iVar35;
        pIVar73[lVar72].FontInfo.index_map = iVar34;
      }
      uVar71 = uVar71 + 8;
    }
    if (iVar34 == 0) goto LAB_001e0a3f;
    pIVar73[lVar72].FontInfo.indexToLocFormat =
         (uint)(ushort)(*(ushort *)(data + (long)(int)sVar29 + 0x32) << 8 |
                       *(ushort *)(data + (long)(int)sVar29 + 0x32) >> 8);
    pIVar38 = dst_tmp_array.Data + iVar70;
    pIVar48 = local_468->GlyphRanges;
    if (pIVar48 == (ImWchar *)0x0) {
      pIVar48 = ImFontAtlas::GetGlyphRangesDefault::ranges;
    }
    pIVar73[lVar72].SrcRanges = pIVar48;
    for (; (*pIVar48 != 0 && (uVar45 = pIVar48[1], uVar45 != 0)); pIVar48 = pIVar48 + 2) {
      uVar71 = (uint)uVar45;
      if ((int)(uint)uVar45 < pIVar73[lVar72].GlyphsHighest) {
        uVar71 = pIVar73[lVar72].GlyphsHighest;
      }
      pIVar73[lVar72].GlyphsHighest = uVar71;
    }
    pIVar38->SrcCount = pIVar38->SrcCount + 1;
    iVar70 = pIVar73[lVar72].GlyphsHighest;
    if (pIVar73[lVar72].GlyphsHighest < pIVar38->GlyphsHighest) {
      iVar70 = pIVar38->GlyphsHighest;
    }
    pIVar38->GlyphsHighest = iVar70;
    lVar72 = local_320 + 1;
  }
  lVar72 = 0;
  auVar84._12_4_ = 0;
  auVar84._0_12_ = local_458._4_12_;
  local_458._0_16_ = auVar84 << 0x20;
  while( true ) {
    uVar54 = (ulong)src_tmp_array.Size;
    if ((long)uVar54 <= lVar72) break;
    pIVar73 = src_tmp_array.Data;
    _y0_2 = lVar72;
    iVar70 = src_tmp_array.Data[lVar72].DstIndex;
    pIVar38 = dst_tmp_array.Data;
    ImBitVector::Create(&src_tmp_array.Data[lVar72].GlyphsSet,
                        src_tmp_array.Data[lVar72].GlyphsHighest + 1);
    if (pIVar38[iVar70].GlyphsSet.Storage.Size == 0) {
      ImBitVector::Create(&pIVar38[iVar70].GlyphsSet,pIVar38[iVar70].GlyphsHighest + 1);
    }
    pIVar73 = pIVar73 + lVar72;
    pIVar39 = (ImFontConfig *)pIVar73->SrcRanges;
    while ((uVar71 = (uint)*(ushort *)&pIVar39->FontData, *(ushort *)&pIVar39->FontData != 0 &&
           (uVar45 = *(ushort *)((long)&pIVar39->FontData + 2), uVar53 = (uint)uVar45, uVar45 != 0))
          ) {
      for (; local_468 = pIVar39, uVar71 <= uVar53; uVar71 = uVar71 + 1) {
        uVar52 = 1 << ((byte)uVar71 & 0x1f);
        if (((pIVar38[iVar70].GlyphsSet.Storage.Data[uVar71 >> 5] >> (uVar71 & 0x1f) & 1) == 0) &&
           (iVar34 = stbtt_FindGlyphIndex(&pIVar73->FontInfo,uVar71), iVar34 != 0)) {
          pIVar73->GlyphsCount = pIVar73->GlyphsCount + 1;
          pIVar38[iVar70].GlyphsCount = pIVar38[iVar70].GlyphsCount + 1;
          uVar54 = (ulong)((uVar71 >> 5) << 2);
          puVar1 = (uint *)((long)(pIVar73->GlyphsSet).Storage.Data + uVar54);
          *puVar1 = *puVar1 | uVar52;
          puVar1 = (uint *)((long)pIVar38[iVar70].GlyphsSet.Storage.Data + uVar54);
          *puVar1 = *puVar1 | uVar52;
          local_458._0_4_ = local_458._0_4_ + 1;
          uVar53 = (uint)*(ushort *)((long)&local_468->FontData + 2);
        }
        pIVar39 = local_468;
      }
      pIVar39 = (ImFontConfig *)((long)&local_468->FontData + 4);
    }
    lVar72 = lVar72 + 1;
  }
  for (lVar72 = 0; lVar72 < (int)uVar54; lVar72 = lVar72 + 1) {
    pIVar22 = src_tmp_array.Data;
    _y0_2 = lVar72;
    pIVar73 = src_tmp_array.Data + lVar72;
    ImVector<int>::reserve(&pIVar73->GlyphsList,src_tmp_array.Data[lVar72].GlyphsCount);
    pIVar39 = (ImFontConfig *)pIVar22[lVar72].GlyphsSet.Storage.Data;
    local_468 = (ImFontConfig *)
                (pIVar39->Name + (long)pIVar22[lVar72].GlyphsSet.Storage.Size * 4 + -0x56);
    iVar70 = 0;
    for (; pIVar39 < local_468; pIVar39 = (ImFontConfig *)((long)&pIVar39->FontData + 4)) {
      uVar71 = *(uint *)&pIVar39->FontData;
      if (uVar71 != 0) {
        for (uVar53 = 0; uVar53 != 0x20; uVar53 = uVar53 + 1) {
          if ((uVar71 >> (uVar53 & 0x1f) & 1) != 0) {
            x0 = uVar53 + iVar70;
            ImVector<int>::push_back(&pIVar73->GlyphsList,&x0);
          }
        }
      }
      iVar70 = iVar70 + 0x20;
    }
    ImVector<unsigned_int>::clear(&pIVar22[lVar72].GlyphsSet.Storage);
    uVar54 = (ulong)(uint)src_tmp_array.Size;
  }
  lVar72 = 0x10;
  for (lVar75 = 0; lVar75 < dst_tmp_array.Size; lVar75 = lVar75 + 1) {
    ImVector<unsigned_int>::clear
              ((ImVector<unsigned_int> *)((long)&(dst_tmp_array.Data)->SrcCount + lVar72));
    lVar72 = lVar72 + 0x20;
  }
  ImVector<ImFontBuildDstData>::clear(&dst_tmp_array);
  buf_rects.Size = 0;
  buf_rects.Capacity = 0;
  buf_rects.Data = (stbrp_rect *)0x0;
  buf_packedchars.Size = 0;
  buf_packedchars.Capacity = 0;
  buf_packedchars.Data = (stbtt_packedchar *)0x0;
  uVar81 = local_458._0_4_;
  ImVector<stbrp_rect>::resize(&buf_rects,local_458._0_4_);
  ImVector<stbtt_packedchar>::resize(&buf_packedchars,uVar81);
  memset(buf_rects.Data,0,(long)buf_rects.Size * 0x18);
  memset(buf_packedchars.Data,0,(long)buf_packedchars.Size * 0x1c);
  auVar20._12_4_ = 0;
  auVar20._0_12_ = auStack_4a4;
  _y0_2 = auVar20 << 0x20;
  iVar70 = 0;
  auVar21._12_4_ = 0;
  auVar21._0_12_ = local_458._4_12_;
  local_458._0_16_ = auVar21 << 0x20;
  uVar54 = 0;
  while ((long)uVar54 < (long)src_tmp_array.Size) {
    iVar34 = src_tmp_array.Data[uVar54].GlyphsCount;
    uVar60 = uVar54;
    if (iVar34 != 0) {
      pIVar73 = src_tmp_array.Data + uVar54;
      pIVar73->Rects = buf_rects.Data + iVar70;
      pIVar73->PackedChars = buf_packedchars.Data + (int)y0_2;
      pIVar39 = (atlas->ConfigData).Data;
      (pIVar73->PackRange).font_size = pIVar39[uVar54].SizePixels;
      (pIVar73->PackRange).first_unicode_codepoint_in_range = 0;
      (pIVar73->PackRange).array_of_unicode_codepoints = (pIVar73->GlyphsList).Data;
      iVar35 = (pIVar73->GlyphsList).Size;
      (pIVar73->PackRange).num_chars = iVar35;
      (pIVar73->PackRange).chardata_for_range = buf_packedchars.Data + (int)y0_2;
      (pIVar73->PackRange).h_oversample = (uchar)pIVar39[uVar54].OversampleH;
      (pIVar73->PackRange).v_oversample = (uchar)pIVar39[uVar54].OversampleV;
      fVar78 = pIVar39[uVar54].SizePixels;
      local_478 = uVar54;
      if (fVar78 <= 0.0) {
        uVar81 = 0x80000000;
        fStack_460 = -0.0;
        fStack_45c = -0.0;
        uVar45 = *(ushort *)((pIVar73->FontInfo).data + (long)(pIVar73->FontInfo).head + 0x12);
        fVar78 = -fVar78 / (float)(ushort)(uVar45 << 8 | uVar45 >> 8);
      }
      else {
        fVar78 = stbtt_ScaleForPixelHeight(&pIVar73->FontInfo,fVar78);
        uVar81 = extraout_XMM0_Db;
        fStack_460 = extraout_XMM0_Dc;
        fStack_45c = extraout_XMM0_Dd;
      }
      local_468 = (ImFontConfig *)CONCAT44(uVar81,fVar78);
      iVar70 = iVar70 + iVar34;
      y0_2 = (float)((int)y0_2 + iVar34);
      iVar34 = atlas->TexGlyphPadding + -1;
      lVar72 = 0;
      for (lVar75 = 0; uVar60 = local_478, lVar75 < iVar35; lVar75 = lVar75 + 1) {
        iVar35 = stbtt_FindGlyphIndex(&pIVar73->FontInfo,(pIVar73->GlyphsList).Data[lVar75]);
        stbtt_GetGlyphBitmapBoxSubpixel
                  (&pIVar73->FontInfo,iVar35,(float)pIVar39[uVar54].OversampleH * (float)local_468,
                   (float)pIVar39[uVar54].OversampleV * (float)local_468,(float)local_468,in_XMM3_Da
                   ,&x0,(int *)&charstrings,(int *)&fdarrayoff,&y1);
        *(stbtt_uint32 *)((long)&pIVar73->Rects->w + lVar72) =
             ((fdarrayoff + iVar34) - x0) + pIVar39[uVar54].OversampleH;
        *(stbtt_uint32 *)((long)&pIVar73->Rects->h + lVar72) =
             ((y1 + iVar34) - charstrings) + pIVar39[uVar54].OversampleV;
        local_458._0_4_ =
             local_458._0_4_ +
             *(int *)((long)&pIVar73->Rects->h + lVar72) *
             *(int *)((long)&pIVar73->Rects->w + lVar72);
        iVar35 = (pIVar73->GlyphsList).Size;
        lVar72 = lVar72 + 0x18;
      }
    }
    uVar54 = uVar60 + 1;
  }
  fVar78 = (float)(int)local_458._0_4_;
  if (fVar78 < 0.0) {
    fVar78 = sqrtf(fVar78);
  }
  else {
    fVar78 = SQRT(fVar78);
  }
  atlas->TexHeight = 0;
  iVar70 = atlas->TexDesiredWidth;
  if (iVar70 < 1) {
    iVar34 = (int)fVar78;
    iVar70 = 0x1000;
    if ((iVar34 < 0xb33) && (iVar70 = 0x800, iVar34 < 0x599)) {
      iVar70 = (uint)(0x2cb < iVar34) * 0x200 + 0x200;
    }
  }
  atlas->TexWidth = iVar70;
  iVar34 = atlas->TexGlyphPadding;
  context = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar35 = iVar70 - iVar34;
  local_418 = (stbrp_node *)ImGui::MemAlloc((long)iVar35 << 4);
  if ((context == (stbrp_context *)0x0) || (local_418 == (stbrp_node *)0x0)) {
    if (context != (stbrp_context *)0x0) {
      ImGui::MemFree(context);
    }
    if (local_418 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_418);
    }
    local_418 = (stbrp_node *)0x0;
    iVar34 = 0;
    iVar70 = 0;
    context = (stbrp_context *)0x0;
  }
  else {
    uVar71 = iVar35 - 1;
    uVar60 = 0;
    psVar17 = local_418;
    uVar54 = uVar60;
    if (0 < (int)uVar71) {
      uVar60 = (ulong)uVar71;
      uVar54 = uVar60;
    }
    while( true ) {
      bVar77 = uVar60 == 0;
      uVar60 = uVar60 - 1;
      if (bVar77) break;
      psVar17->next = psVar17 + 1;
      psVar17 = psVar17 + 1;
    }
    local_418[uVar54].next = (stbrp_node *)0x0;
    context->init_mode = 1;
    context->heuristic = 0;
    context->free_head = local_418;
    context->active_head = context->extra;
    context->width = iVar35;
    context->height = 0x8000 - iVar34;
    context->num_nodes = iVar35;
    context->align = (int)(uVar71 + iVar35) / iVar35;
    context->extra[0].x = 0;
    context->extra[0].y = 0;
    context->extra[0].next = context->extra + 1;
    context->extra[1].x = iVar35;
    context->extra[1].y = 0x40000000;
    context->extra[1].next = (stbrp_node *)0x0;
  }
  ImFontAtlasBuildPackCustomRects(atlas,context);
  for (lVar72 = 0; lVar72 < src_tmp_array.Size; lVar72 = lVar72 + 1) {
    pIVar73 = src_tmp_array.Data;
    if (src_tmp_array.Data[lVar72].GlyphsCount != 0) {
      stbrp_pack_rects(context,src_tmp_array.Data[lVar72].Rects,
                       src_tmp_array.Data[lVar72].GlyphsCount);
      lVar75 = 0x14;
      for (lVar37 = 0; lVar37 < pIVar73[lVar72].GlyphsCount; lVar37 = lVar37 + 1) {
        psVar57 = pIVar73[lVar72].Rects;
        if (*(int *)((long)&psVar57->id + lVar75) != 0) {
          iVar35 = *(int *)((long)psVar57 + lVar75 + -0xc) + *(int *)((long)psVar57 + lVar75 + -4);
          if (iVar35 < atlas->TexHeight) {
            iVar35 = atlas->TexHeight;
          }
          atlas->TexHeight = iVar35;
        }
        lVar75 = lVar75 + 0x18;
      }
    }
  }
  uVar71 = atlas->TexHeight;
  if ((atlas->Flags & 1) == 0) {
    uVar71 = (int)(uVar71 - 1) >> 1 | uVar71 - 1;
    uVar71 = (int)uVar71 >> 2 | uVar71;
    uVar71 = (int)uVar71 >> 4 | uVar71;
    uVar71 = (int)uVar71 >> 8 | uVar71;
    uVar71 = (int)uVar71 >> 0x10 | uVar71;
  }
  iVar35 = uVar71 + 1;
  atlas->TexHeight = iVar35;
  auVar80._0_4_ = (float)atlas->TexWidth;
  auVar80._4_4_ = (float)iVar35;
  auVar80._8_8_ = 0;
  auVar84 = divps(_DAT_0021cb90,auVar80);
  atlas->TexUvScale = auVar84._0_8_;
  puVar40 = (uchar *)ImGui::MemAlloc((long)(iVar35 * atlas->TexWidth));
  atlas->TexPixelsAlpha8 = puVar40;
  local_2d8 = context;
  memset(puVar40,0,(long)atlas->TexHeight * (long)atlas->TexWidth);
  puVar40 = atlas->TexPixelsAlpha8;
  lVar72 = (long)iVar70;
  local_2c0 = puVar40 + 1;
  lVar75 = 0;
  local_3f4 = iVar70;
  local_258 = iVar34;
  iStack_254 = iVar34;
  iStack_250 = iVar34;
  iStack_24c = iVar34;
  while (lVar75 < src_tmp_array.Size) {
    local_318 = lVar75;
    if (src_tmp_array.Data[lVar75].GlyphsCount != 0) {
      local_2d0 = (atlas->ConfigData).Data;
      pIVar73 = src_tmp_array.Data + lVar75;
      psVar57 = pIVar73->Rects;
      bVar77 = true;
      uVar54 = 0xffffffffffffffff;
      lVar75 = 0;
      local_310 = psVar57;
      while (bVar77) {
        fVar78 = (pIVar73->PackRange).font_size;
        if (fVar78 <= 0.0) {
          uStack_274 = 0x80000000;
          uStack_270 = 0x80000000;
          uStack_26c = 0x80000000;
          uVar45 = *(ushort *)((pIVar73->FontInfo).data + (long)(pIVar73->FontInfo).head + 0x12);
          local_278 = -fVar78 / (float)(ushort)(uVar45 << 8 | uVar45 >> 8);
          uStack_264 = in_XMM4_Db;
          uStack_260 = in_XMM4_Dc;
          uStack_25c = in_XMM4_Dd;
        }
        else {
          local_278 = stbtt_ScaleForPixelHeight(&pIVar73->FontInfo,fVar78);
          uStack_274 = extraout_var_00._0_4_;
          uStack_270 = extraout_var_00._4_4_;
          uStack_26c = extraout_var_00._8_4_;
          uStack_264 = in_XMM4_Db;
          uStack_260 = in_XMM4_Dc;
          uStack_25c = in_XMM4_Dd;
        }
        bVar7 = (pIVar73->PackRange).h_oversample;
        local_3f8 = (float)bVar7;
        local_458[0] = (pIVar73->PackRange).v_oversample;
        local_458._0_8_ = CONCAT71(0,local_458[0]);
        auVar84 = local_458._0_16_;
        local_3c0 = 0.0;
        local_3c4 = 0.0;
        if ((ImFontConfig *)(ulong)bVar7 != (ImFontConfig *)0x0) {
          local_468._0_4_ = (float)(uint)bVar7;
          local_3c4 = (float)(1 - (int)(float)local_468) / (local_3f8 + local_3f8);
        }
        fVar78 = (float)local_458[0];
        if (CONCAT71(0,local_458[0]) != 0) {
          local_458._1_3_ = 0;
          local_3c0 = (float)(1 - local_458._0_4_) / (fVar78 + fVar78);
        }
        fVar89 = 1.0 / local_3f8;
        lVar75 = (long)(int)lVar75;
        local_3f8 = local_3f8 * local_278;
        local_268 = fVar78 * local_278;
        fVar82 = local_268;
        if (local_3f8 <= local_268) {
          fVar82 = local_3f8;
        }
        fVar82 = (0.35 / fVar82) * (0.35 / fVar82);
        local_248 = -local_268;
        in_XMM4_Db = uStack_264 ^ 0x80000000;
        in_XMM4_Dc = uStack_260 ^ 0x80000000;
        in_XMM4_Dd = uStack_25c ^ 0x80000000;
        uVar60 = 0;
        local_468 = (ImFontConfig *)(ulong)bVar7;
        local_458._0_16_ = auVar84;
        uStack_244 = in_XMM4_Db;
        uStack_240 = in_XMM4_Dc;
        uStack_23c = in_XMM4_Dd;
LAB_001df06c:
        if ((long)uVar60 < (long)(pIVar73->PackRange).num_chars) {
          if (psVar57[lVar75].was_packed != 0) {
            uVar11 = psVar57[lVar75].w;
            uVar15 = psVar57[lVar75].h;
            if (uVar11 == 0) {
              if ((uVar15 == 0) && (-1 < (int)uVar54)) {
                psVar13 = (pIVar73->PackRange).chardata_for_range;
                psVar14 = psVar13 + (uVar54 & 0xffffffff);
                uVar24 = psVar14->x0;
                uVar25 = psVar14->y0;
                uVar26 = psVar14->x1;
                uVar27 = psVar14->y1;
                fVar88 = psVar14->xoff;
                fVar83 = psVar14->yoff;
                psVar14 = psVar13 + (uVar54 & 0xffffffff);
                fVar79 = psVar14->xadvance;
                fVar85 = psVar14->xoff2;
                fVar86 = psVar14->yoff2;
                psVar23 = psVar13 + uVar60;
                psVar23->yoff = psVar14->yoff;
                psVar23->xadvance = fVar79;
                psVar23->xoff2 = fVar85;
                psVar23->yoff2 = fVar86;
                psVar13 = psVar13 + uVar60;
                psVar13->x0 = uVar24;
                psVar13->y0 = uVar25;
                psVar13->x1 = uVar26;
                psVar13->y1 = uVar27;
                psVar13->xoff = fVar88;
                psVar13->yoff = fVar83;
              }
              goto LAB_001e072c;
            }
            if (uVar15 == 0) goto LAB_001e072c;
            piVar58 = (pIVar73->PackRange).array_of_unicode_codepoints;
            if (piVar58 == (int *)0x0) {
              iVar70 = (pIVar73->PackRange).first_unicode_codepoint_in_range + (int)uVar60;
            }
            else {
              iVar70 = piVar58[uVar60];
            }
            local_2a0 = (pIVar73->PackRange).chardata_for_range + uVar60;
            fVar79 = fVar89;
            local_300 = uVar60;
            local_2f8 = lVar75;
            uVar71 = stbtt_FindGlyphIndex(&pIVar73->FontInfo,iVar70);
            uVar2 = psVar57[lVar75].x;
            uVar4 = psVar57[lVar75].y;
            fVar85 = (float)(uVar11 - local_258);
            psVar57[lVar75].w = (stbrp_coord)fVar85;
            psVar57[lVar75].h = uVar15 - iStack_254;
            psVar57[lVar75].x = uVar2 + iStack_250;
            psVar57[lVar75].y = uVar4 + iStack_24c;
            puVar74 = (pIVar73->FontInfo).data;
            uVar45 = *(ushort *)(puVar74 + (long)(pIVar73->FontInfo).hhea + 0x22) << 8 |
                     *(ushort *)(puVar74 + (long)(pIVar73->FontInfo).hhea + 0x22) >> 8;
            iVar70 = (pIVar73->FontInfo).hmtx;
            lVar37 = (ulong)uVar45 * 4 + (long)iVar70 + -4;
            lVar50 = (ulong)uVar45 * 4 + (long)iVar70 + -3;
            if ((int)uVar71 < (int)(uint)uVar45) {
              lVar37 = (long)(int)(uVar71 * 4) + (long)iVar70;
              lVar50 = (long)(int)(uVar71 * 4) + 1 + (long)iVar70;
            }
            bVar7 = puVar74[lVar37];
            bVar8 = puVar74[lVar50];
            stbtt_GetGlyphBitmapBoxSubpixel
                      (&pIVar73->FontInfo,uVar71,local_3f8,local_268,fVar85,fVar79,&x0_1,&y0_1,&x1_1
                       ,&local_280);
            iVar70 = psVar57[lVar75].x;
            iVar34 = psVar57[lVar75].y;
            iVar35 = psVar57[lVar75].w;
            iVar36 = psVar57[lVar75].h;
            local_2f0 = (ulong)uVar71;
            uVar71 = stbtt_GetGlyphShape(&pIVar73->FontInfo,uVar71,(stbtt_vertex **)&fdarrayoff);
            uVar53 = (iVar35 - (int)local_468) + 1;
            stbtt_GetGlyphBitmapBoxSubpixel
                      (&pIVar73->FontInfo,(int)local_2f0,local_3f8,local_268,fVar85,fVar79,&y1,&iy0,
                       (int *)0x0,(int *)0x0);
            iVar65 = y1;
            local_43c = uVar53;
            if ((uVar53 != 0) && (iVar36 = (iVar36 - local_458._0_4_) + 1, iVar36 != 0)) {
              local_288 = puVar40 + iVar34 * lVar72 + (long)iVar70;
              iVar35 = iVar35 - (int)(float)local_468;
              lVar37 = CONCAT44(uStack_3fc,fdarrayoff);
              local_308 = (ulong)(uint)iy0;
              uVar41 = 0;
              uVar60 = (ulong)uVar71;
              if ((int)uVar71 < 1) {
                uVar60 = uVar41;
              }
              uVar66 = 0;
              for (; uVar60 * 0xe - uVar41 != 0; uVar41 = uVar41 + 0xe) {
                uVar66 = (ulong)((int)uVar66 + (uint)(*(char *)(lVar37 + 0xc + uVar41) == '\x01'));
              }
              if (((int)uVar66 != 0) &&
                 (local_478 = uVar66, ptr = ImGui::MemAlloc(uVar66 * 4), ptr != (void *)0x0)) {
                local_408 = (stbtt__point *)0x0;
                iVar70 = 0;
                iVar47 = 0;
                iVar34 = 0;
                do {
                  if (iVar47 == 1) {
                    local_408 = (stbtt__point *)ImGui::MemAlloc((long)iVar34 << 3);
                    if (local_408 == (stbtt__point *)0x0) {
                      ImGui::MemFree((void *)0x0);
                      ImGui::MemFree(ptr);
                      break;
                    }
                  }
                  else if (iVar47 == 2) goto LAB_001df560;
                  x0 = 0;
                  fVar79 = 0.0;
                  fVar85 = 0.0;
                  uVar71 = 0xffffffff;
                  for (lVar50 = 0; uVar60 * 0xe - lVar50 != 0; lVar50 = lVar50 + 0xe) {
                    iVar34 = x0;
                    switch(*(undefined1 *)(lVar37 + 0xc + lVar50)) {
                    case 1:
                      if (-1 < (int)uVar71) {
                        *(int *)((long)ptr + (ulong)uVar71 * 4) = x0 - iVar70;
                      }
                      uVar71 = uVar71 + 1;
                      auVar84 = pshuflw(ZEXT416(*(uint *)(lVar37 + lVar50)),
                                        ZEXT416(*(uint *)(lVar37 + lVar50)),0x60);
                      fVar79 = (float)(auVar84._0_4_ >> 0x10);
                      fVar85 = (float)(auVar84._4_4_ >> 0x10);
                      iVar70 = x0;
                      iVar34 = x0 + 1;
                      if (local_408 != (stbtt__point *)0x0) {
                        local_408[x0].x = fVar79;
                        local_408[x0].y = fVar85;
                      }
                      break;
                    case 2:
                      auVar84 = pshuflw(ZEXT416(*(uint *)(lVar37 + lVar50)),
                                        ZEXT416(*(uint *)(lVar37 + lVar50)),0x60);
                      fVar79 = (float)(auVar84._0_4_ >> 0x10);
                      fVar85 = (float)(auVar84._4_4_ >> 0x10);
                      iVar34 = x0 + 1;
                      if (local_408 != (stbtt__point *)0x0) {
                        local_408[x0].x = fVar79;
                        local_408[x0].y = fVar85;
                      }
                      break;
                    case 3:
                      stbtt__tesselate_curve
                                (local_408,&x0,fVar79,fVar85,
                                 (float)(int)*(short *)(lVar37 + 4 + lVar50),
                                 (float)(int)*(short *)(lVar37 + 6 + lVar50),
                                 (float)(int)*(short *)(lVar37 + lVar50),
                                 (float)(int)*(short *)(lVar37 + 2 + lVar50),fVar82,0);
                      goto LAB_001df4e1;
                    case 4:
                      stbtt__tesselate_cubic
                                (local_408,&x0,fVar79,fVar85,
                                 (float)(int)*(short *)(lVar37 + 4 + lVar50),
                                 (float)(int)*(short *)(lVar37 + 6 + lVar50),
                                 (float)(int)*(short *)(lVar37 + 8 + lVar50),
                                 (float)(int)*(short *)(lVar37 + 10 + lVar50),
                                 (float)(int)*(short *)(lVar37 + lVar50),
                                 (float)(int)*(short *)(lVar37 + 2 + lVar50),fVar82,0);
LAB_001df4e1:
                      auVar84 = pshuflw(ZEXT416(*(uint *)(lVar37 + lVar50)),
                                        ZEXT416(*(uint *)(lVar37 + lVar50)),0x60);
                      fVar79 = (float)(auVar84._0_4_ >> 0x10);
                      fVar85 = (float)(auVar84._4_4_ >> 0x10);
                      iVar34 = x0;
                    }
                    x0 = iVar34;
                  }
                  *(int *)((long)ptr + (long)(int)uVar71 * 4) = x0 - iVar70;
                  iVar47 = iVar47 + 1;
                  iVar34 = x0;
                } while( true );
              }
            }
            goto LAB_001e0144;
          }
          goto LAB_001e072c;
        }
        bVar77 = false;
      }
      fVar78 = local_2d0[local_318].RasterizerMultiply;
      if ((fVar78 != 1.0) || (NAN(fVar78))) {
        ImFontAtlasBuildMultiplyCalcLookupTable((uchar *)&x0,fVar78);
        piVar58 = &pIVar73->Rects->was_packed;
        for (iVar70 = 0; iVar70 < pIVar73->GlyphsCount; iVar70 = iVar70 + 1) {
          if (*piVar58 != 0) {
            ImFontAtlasBuildMultiplyRectAlpha8
                      ((uchar *)&x0,atlas->TexPixelsAlpha8,piVar58[-2],piVar58[-1],piVar58[-4],
                       piVar58[-3],atlas->TexWidth);
          }
          piVar58 = piVar58 + 6;
        }
      }
      pIVar73->Rects = (stbrp_rect *)0x0;
    }
    lVar75 = local_318 + 1;
  }
  ImGui::MemFree(local_418);
  ImGui::MemFree(local_2d8);
  ImVector<stbrp_rect>::clear(&buf_rects);
  for (lVar72 = 0; lVar72 < src_tmp_array.Size; lVar72 = lVar72 + 1) {
    if (src_tmp_array.Data[lVar72].GlyphsCount != 0) {
      pIVar73 = src_tmp_array.Data + lVar72;
      pIVar39 = (atlas->ConfigData).Data;
      font = pIVar39[lVar72].DstFont;
      fVar78 = stbtt_ScaleForPixelHeight(&pIVar73->FontInfo,pIVar39[lVar72].SizePixels);
      puVar40 = (pIVar73->FontInfo).data;
      lVar75 = (long)(pIVar73->FontInfo).hhea;
      uVar45 = *(ushort *)(puVar40 + lVar75 + 4);
      uVar45 = uVar45 << 8 | uVar45 >> 8;
      fVar82 = -1.0;
      if (0 < (short)uVar45) {
        fVar82 = 1.0;
      }
      uVar46 = *(ushort *)(puVar40 + lVar75 + 6);
      uVar46 = uVar46 << 8 | uVar46 >> 8;
      fVar89 = -1.0;
      if (0 < (short)uVar46) {
        fVar89 = 1.0;
      }
      pIVar39 = pIVar39 + lVar72;
      ImFontAtlasBuildSetupFont
                (atlas,font,pIVar39,(float)(int)((float)(int)(short)uVar45 * fVar78 + fVar82),
                 (float)(int)((float)(int)(short)uVar46 * fVar78 + fVar89));
      local_468 = (ImFontConfig *)CONCAT44(local_468._4_4_,(pIVar39->GlyphOffset).x);
      local_458._0_16_ =
           ZEXT416((uint)((float)(int)(font->Ascent + 0.5) + (pIVar39->GlyphOffset).y));
      lVar37 = 0;
      for (lVar75 = 0; lVar75 < pIVar73->GlyphsCount; lVar75 = lVar75 + 1) {
        psVar14 = pIVar73->PackedChars;
        fVar82 = 1.0 / (float)atlas->TexHeight;
        fVar78 = 1.0 / (float)atlas->TexWidth;
        ImFont::AddGlyph(font,pIVar39,*(ImWchar *)((pIVar73->GlyphsList).Data + lVar75),
                         *(float *)((long)&psVar14->xoff + lVar37) + 0.0 + (float)local_468,
                         *(float *)((long)&psVar14->yoff + lVar37) + 0.0 + (float)local_458._0_4_,
                         *(float *)((long)&psVar14->xoff2 + lVar37) + 0.0 + (float)local_468,
                         *(float *)((long)&psVar14->yoff2 + lVar37) + 0.0 + (float)local_458._0_4_,
                         (float)*(ushort *)((long)&psVar14->x0 + lVar37) * fVar78,
                         (float)*(ushort *)((long)&psVar14->y0 + lVar37) * fVar82,
                         (float)*(ushort *)((long)&psVar14->x1 + lVar37) * fVar78,
                         (float)*(ushort *)((long)&psVar14->y1 + lVar37) * fVar82,
                         *(float *)((long)&psVar14->xadvance + lVar37));
        lVar37 = lVar37 + 0x1c;
      }
    }
  }
  ImVector<ImFontBuildSrcData>::clear_destruct(&src_tmp_array);
  ImFontAtlasBuildFinish(atlas);
  ImVector<stbtt_packedchar>::~ImVector(&buf_packedchars);
  ImVector<stbrp_rect>::~ImVector(&buf_rects);
LAB_001e0a3f:
  bVar77 = local_2c8 <= local_320;
  ImVector<ImFontBuildDstData>::~ImVector(&dst_tmp_array);
  ImVector<ImFontBuildSrcData>::~ImVector(&src_tmp_array);
  return bVar77;
LAB_001df560:
  if (local_408 != (stbtt__point *)0x0) {
    iVar70 = 0;
    for (uVar60 = 0; local_478 != uVar60; uVar60 = uVar60 + 1) {
      iVar70 = iVar70 + *(int *)((long)ptr + uVar60 * 4);
    }
    p = (stbtt__edge *)ImGui::MemAlloc((long)(iVar70 + 1) * 0x14);
    uVar71 = local_43c;
    if (p != (stbtt__edge *)0x0) {
      iVar70 = 0;
      iVar34 = 0;
      for (uVar60 = 0; uVar60 != local_478; uVar60 = uVar60 + 1) {
        iVar47 = *(int *)((long)ptr + uVar60 * 4);
        uVar66 = (ulong)(iVar47 - 1);
        iVar67 = iVar47;
        for (uVar41 = 0; (long)uVar41 < (long)iVar67; uVar41 = uVar41 + 1) {
          uVar66 = (ulong)(int)uVar66;
          if ((local_408[(long)iVar70 + uVar66].y != local_408[(long)iVar70 + uVar41].y) ||
             (NAN(local_408[(long)iVar70 + uVar66].y) || NAN(local_408[(long)iVar70 + uVar41].y))) {
            psVar59 = p + iVar34;
            p[iVar34].invert = 0;
            uVar55 = uVar41;
            if (local_408[(long)iVar70 + uVar41].y <= local_408[(long)iVar70 + uVar66].y &&
                local_408[(long)iVar70 + uVar66].y != local_408[(long)iVar70 + uVar41].y) {
              psVar59->invert = 1;
              uVar55 = uVar66;
              uVar66 = uVar41;
            }
            psVar59->x0 = local_408[(long)iVar70 + uVar55].x * local_3f8 + 0.0;
            psVar59->y0 = local_408[(long)iVar70 + uVar55].y * local_248 + 0.0;
            psVar59->x1 = local_408[(long)iVar70 + uVar66].x * local_3f8 + 0.0;
            psVar59->y1 = local_408[(long)iVar70 + uVar66].y * local_248 + 0.0;
            iVar34 = iVar34 + 1;
            iVar67 = *(int *)((long)ptr + uVar60 * 4);
          }
          uVar66 = uVar41 & 0xffffffff;
        }
        iVar70 = iVar47 + iVar70;
      }
      stbtt__sort_edges_quicksort(p,iVar34);
      psVar59 = p;
      for (uVar60 = 1; (long)uVar60 < (long)iVar34; uVar60 = uVar60 + 1) {
        uVar3 = p[uVar60].x0;
        uVar5 = p[uVar60].y0;
        uStack_230 = p[uVar60].invert;
        uVar12 = p[uVar60].x1;
        uVar16 = p[uVar60].y1;
        psVar61 = psVar59;
        for (uVar41 = uVar60; 0 < (long)uVar41; uVar41 = uVar41 - 1) {
          if (psVar61->y0 <= (float)uVar5) goto LAB_001df776;
          psVar61[1].invert = psVar61->invert;
          fVar79 = psVar61->y0;
          fVar85 = psVar61->x1;
          fVar86 = psVar61->y1;
          psVar61[1].x0 = psVar61->x0;
          psVar61[1].y0 = fVar79;
          psVar61[1].x1 = fVar85;
          psVar61[1].y1 = fVar86;
          psVar61 = psVar61 + -1;
        }
        uVar41 = 0;
LAB_001df776:
        iVar70 = (int)uVar41;
        if (uVar60 != (uVar41 & 0xffffffff)) {
          p[iVar70].x0 = (float)uVar3;
          p[iVar70].y0 = (float)uVar5;
          p[iVar70].x1 = (float)uVar12;
          p[iVar70].y1 = (float)uVar16;
          p[iVar70].invert = uStack_230;
        }
        psVar59 = psVar59 + 1;
        x0 = uVar12;
        uStack_234 = uVar16;
      }
      _charstrings = (stbtt__active_edge *)0x0;
      scanline_00 = (float *)&x0;
      if (0x40 < (int)uVar71) {
        scanline_00 = (float *)ImGui::MemAlloc((ulong)uVar71 * 8 + 4);
        uVar71 = local_43c;
      }
      local_290 = (long)(int)uVar71;
      scanline = scanline_00 + local_290;
      p[iVar34].y0 = (float)((int)local_308 + iVar36) + 1.0;
      local_2a8 = local_290 * 4;
      local_2b0 = (long)(iVar35 + 2) << 2;
      local_3ec = (float)(int)uVar71;
      if ((int)uVar71 < 1) {
        uVar71 = 0;
      }
      local_2b8 = 0;
      if (0 < local_290) {
        local_2b8 = local_290;
      }
      iVar70 = 0;
      if (iVar36 < 1) {
        iVar36 = 0;
      }
      psVar43 = (stbtt__active_edge *)0x0;
      local_3f0 = 0;
      local_380 = (undefined8 *)0x0;
      uVar60 = local_308;
      psVar59 = p;
      local_43c = uVar71;
      for (iVar34 = 0; iVar34 != iVar36; iVar34 = iVar34 + 1) {
        fVar79 = (float)(int)uVar60;
        memset(scanline_00,0,local_2a8);
        memset(scanline,0,local_2b0);
        psVar68 = (stbtt__active_edge *)&charstrings;
        while (psVar49 = psVar68, psVar76 = psVar49->next, psVar76 != (stbtt__active_edge *)0x0) {
          psVar68 = psVar76;
          if (psVar76->ey <= fVar79) {
            psVar49->next = psVar76->next;
            psVar76->direction = 0.0;
            psVar76->next = psVar43;
            psVar68 = psVar49;
            psVar43 = psVar76;
          }
        }
        bVar77 = (int)local_308 != 0;
        fVar85 = fVar79 + 1.0;
        for (; fVar86 = psVar59->y0, fVar86 <= fVar85; psVar59 = psVar59 + 1) {
          fVar88 = psVar59->y1;
          if ((fVar86 != fVar88) || (NAN(fVar86) || NAN(fVar88))) {
            if (psVar43 == (stbtt__active_edge *)0x0) {
              if (local_3f0 == 0) {
                puVar42 = (undefined8 *)ImGui::MemAlloc(0x6408);
                if (puVar42 == (undefined8 *)0x0) {
                  psVar43 = (stbtt__active_edge *)0x0;
                  local_3f0 = 0;
                  goto LAB_001dfac7;
                }
                *puVar42 = local_380;
                fVar86 = psVar59->y0;
                fVar88 = psVar59->y1;
                local_3f0 = 799;
              }
              else {
                local_3f0 = local_3f0 + -1;
                puVar42 = local_380;
              }
              psVar76 = (stbtt__active_edge *)(puVar42 + (long)local_3f0 * 4 + 1);
              psVar68 = (stbtt__active_edge *)0x0;
              local_380 = puVar42;
            }
            else {
              psVar68 = psVar43->next;
              psVar76 = psVar43;
            }
            psVar43 = psVar68;
            fVar86 = (psVar59->x1 - psVar59->x0) / (fVar88 - fVar86);
            psVar76->fdx = fVar86;
            psVar76->fdy = (float)(-(uint)(fVar86 != 0.0) & (uint)(1.0 / fVar86));
            psVar76->fx = ((fVar79 - psVar59->y0) * fVar86 + psVar59->x0) - (float)iVar65;
            psVar76->direction = *(float *)(&DAT_0022d4f4 + (ulong)(psVar59->invert == 0) * 4);
            psVar76->sy = psVar59->y0;
            fVar86 = psVar59->y1;
            psVar76->ey = fVar86;
            psVar76->next = (stbtt__active_edge *)0x0;
            if (fVar86 < fVar79 && (iVar34 == 0 && bVar77)) {
              psVar76->ey = fVar79;
            }
            psVar76->next = _charstrings;
            _charstrings = psVar76;
          }
LAB_001dfac7:
        }
        if (_charstrings != (stbtt__active_edge *)0x0) {
          local_298 = psVar59;
          for (psVar68 = _charstrings; psVar59 = local_298, psVar68 != (stbtt__active_edge *)0x0;
              psVar68 = psVar68->next) {
            fVar86 = psVar68->fx;
            fVar88 = psVar68->fdx;
            if ((fVar88 != 0.0) || (NAN(fVar88))) {
              fVar94 = fVar88 + fVar86;
              fVar83 = psVar68->sy;
              fVar87 = (float)(~-(uint)(fVar79 < fVar83) & (uint)fVar86 |
                              (uint)((fVar83 - fVar79) * fVar88 + fVar86) & -(uint)(fVar79 < fVar83)
                              );
              if (0.0 <= fVar87) {
                fVar90 = psVar68->ey;
                fVar93 = (float)(-(uint)(fVar90 < fVar85) &
                                 (uint)((fVar90 - fVar79) * fVar88 + fVar86) |
                                ~-(uint)(fVar90 < fVar85) & (uint)fVar94);
                if (((0.0 <= fVar93) && (fVar87 < local_3ec)) && (fVar93 < local_3ec)) {
                  if (fVar83 <= fVar79) {
                    fVar83 = fVar79;
                  }
                  iVar35 = (int)fVar87;
                  if (fVar85 <= fVar90) {
                    fVar90 = fVar85;
                  }
                  iVar47 = (int)fVar93;
                  if (iVar35 == iVar47) {
                    fVar95 = (fVar90 - fVar83) * psVar68->direction;
                    lVar37 = (long)iVar35;
                    scanline_00[lVar37] =
                         ((((float)iVar35 + 1.0) - fVar93) + (((float)iVar35 + 1.0) - fVar87)) * 0.5
                         * fVar95 + scanline_00[lVar37];
                  }
                  else {
                    fVar88 = psVar68->fdy;
                    fVar92 = fVar93;
                    iVar67 = iVar35;
                    if (fVar93 < fVar87) {
                      fVar91 = fVar79 - fVar83;
                      fVar83 = (fVar79 - fVar90) + fVar85;
                      fVar88 = -fVar88;
                      fVar92 = fVar87;
                      fVar86 = fVar94;
                      fVar90 = fVar91 + fVar85;
                      iVar67 = iVar47;
                      iVar47 = iVar35;
                      fVar87 = fVar93;
                    }
                    iVar35 = iVar67 + 1;
                    fVar91 = (float)iVar47;
                    fVar93 = ((float)iVar35 - fVar86) * fVar88 + fVar79;
                    fVar94 = fVar85;
                    if (fVar93 <= fVar85) {
                      fVar94 = fVar93;
                    }
                    fVar95 = psVar68->direction;
                    fVar93 = (fVar94 - fVar83) * fVar95;
                    fVar86 = (fVar91 - fVar86) * fVar88 + fVar79;
                    scanline_00[iVar67] =
                         ((float)iVar35 - fVar87) * fVar93 * 0.5 + scanline_00[iVar67];
                    if ((fVar85 < fVar86) && (fVar86 = fVar85, iVar47 - iVar35 != 0)) {
                      fVar88 = (fVar85 - fVar94) / (float)(iVar47 - iVar35);
                    }
                    lVar37 = (long)iVar47;
                    for (lVar50 = (long)iVar35; lVar50 < lVar37; lVar50 = lVar50 + 1) {
                      scanline_00[lVar50] = fVar88 * fVar95 * 0.5 + fVar93 + scanline_00[lVar50];
                      fVar93 = fVar93 + fVar88 * fVar95;
                    }
                    scanline_00[lVar37] =
                         (((fVar91 + 1.0) - fVar92) + ((fVar91 + 1.0) - fVar91)) * 0.5 *
                         (fVar90 - fVar86) * fVar95 + fVar93 + scanline_00[lVar37];
                    fVar95 = (fVar90 - fVar83) * fVar95;
                  }
                  scanline[lVar37 + 1] = fVar95 + scanline[lVar37 + 1];
                  goto LAB_001e0015;
                }
              }
              local_2e8 = fVar86;
              uStack_2e4 = 0;
              uStack_2e0 = 0;
              uStack_2dc = 0;
              uVar71 = 0;
              while (local_43c != uVar71) {
                fVar83 = (float)(int)uVar71;
                fVar87 = (float)(int)(uVar71 + 1);
                fVar86 = (fVar83 - local_2e8) / fVar88 + fVar79;
                fVar90 = (fVar87 - local_2e8) / fVar88 + fVar79;
                local_478 = CONCAT44(local_478._4_4_,fVar83);
                if ((fVar83 <= local_2e8) || (fVar94 <= fVar87)) {
                  if ((fVar83 <= fVar94) || (local_2e8 <= fVar87)) {
                    fVar93 = fVar79;
                    fVar92 = local_2e8;
                    if (((fVar83 <= local_2e8) || (fVar94 <= fVar83)) &&
                       ((fVar83 <= fVar94 || (local_2e8 <= fVar83)))) {
                      fVar86 = fVar79;
                      fVar83 = local_2e8;
                      if (((local_2e8 < fVar87) && (fVar87 < fVar94)) ||
                         ((fVar94 < fVar87 && (fVar87 < local_2e8)))) goto LAB_001dfcf9;
                      goto LAB_001dfdae;
                    }
                  }
                  else {
                    stbtt__handle_clipped_edge
                              (scanline_00,uVar71,psVar68,local_2e8,fVar79,fVar87,fVar90);
                    fVar93 = fVar90;
                    fVar92 = fVar87;
                    fVar83 = (float)local_478;
                  }
                  stbtt__handle_clipped_edge(scanline_00,uVar71,psVar68,fVar92,fVar93,fVar83,fVar86)
                  ;
                  fVar83 = (float)local_478;
                }
                else {
                  stbtt__handle_clipped_edge
                            (scanline_00,uVar71,psVar68,local_2e8,fVar79,fVar83,fVar86);
                  fVar83 = (float)local_478;
LAB_001dfcf9:
                  stbtt__handle_clipped_edge(scanline_00,uVar71,psVar68,fVar83,fVar86,fVar87,fVar90)
                  ;
                  fVar86 = fVar90;
                  fVar83 = fVar87;
                }
LAB_001dfdae:
                stbtt__handle_clipped_edge(scanline_00,uVar71,psVar68,fVar83,fVar86,fVar94,fVar85);
                uVar71 = uVar71 + 1;
              }
            }
            else if (fVar86 < local_3ec) {
              if (0.0 <= fVar86) {
                uStack_2e4 = 0;
                uStack_2e0 = 0;
                uStack_2dc = 0;
                local_2e8 = fVar86;
                stbtt__handle_clipped_edge
                          (scanline_00,(int)fVar86,psVar68,fVar86,fVar79,fVar86,fVar85);
                iVar35 = (int)fVar86 + 1;
                fVar86 = local_2e8;
              }
              else {
                iVar35 = 0;
              }
              stbtt__handle_clipped_edge(scanline,iVar35,psVar68,fVar86,fVar79,fVar86,fVar85);
            }
LAB_001e0015:
          }
        }
        fVar79 = 0.0;
        lVar37 = local_2b8;
        pfVar51 = scanline_00;
        iVar35 = iVar70;
        while (bVar77 = lVar37 != 0, lVar37 = lVar37 + -1, bVar77) {
          fVar79 = fVar79 + pfVar51[local_290];
          iVar47 = (int)(ABS(*pfVar51 + fVar79) * 255.0 + 0.5);
          if (0xfe < iVar47) {
            iVar47 = 0xff;
          }
          local_288[iVar35] = (uchar)iVar47;
          iVar35 = iVar35 + 1;
          pfVar51 = pfVar51 + 1;
        }
        for (psVar44 = &charstrings; lVar37 = *(long *)psVar44, lVar37 != 0;
            psVar44 = *(stbtt_uint32 **)psVar44) {
          *(float *)(lVar37 + 8) = *(float *)(lVar37 + 0xc) + *(float *)(lVar37 + 8);
        }
        uVar60 = (ulong)((int)uVar60 + 1);
        iVar70 = iVar70 + local_3f4;
      }
      while (local_380 != (undefined8 *)0x0) {
        puVar42 = (undefined8 *)*local_380;
        ImGui::MemFree(local_380);
        local_380 = puVar42;
      }
      if (scanline_00 != (float *)&x0) {
        ImGui::MemFree(scanline_00);
      }
      ImGui::MemFree(p);
    }
    ImGui::MemFree(ptr);
    ImGui::MemFree(local_408);
  }
LAB_001e0144:
  ImGui::MemFree((void *)CONCAT44(uStack_3fc,fdarrayoff));
  iVar70 = psVar57[lVar75].x;
  if (1 < (byte)local_468) {
    lVar37 = (long)(psVar57[lVar75].y * local_3f4);
    puVar74 = puVar40 + lVar37 + iVar70;
    iVar34 = psVar57[lVar75].w;
    iVar35 = iVar34 - (int)local_468;
    x0 = 0;
    uStack_234 = 0;
    iVar65 = 0;
    iVar36 = psVar57[lVar75].h;
    if (psVar57[lVar75].h < 1) {
      iVar36 = 0;
    }
    if (iVar35 < 0) {
      iVar35 = -1;
    }
    lVar50 = (long)iVar35 + 1;
    puVar56 = local_2c0 + iVar70 + lVar37 + (long)iVar35;
    for (; pIVar39 = local_468, iVar65 != iVar36; iVar65 = iVar65 + 1) {
      __memset_chk(&x0,0,local_468);
      puVar63 = puVar56;
      lVar37 = lVar50;
      switch((int)pIVar39) {
      case 2:
        uVar71 = 0;
        for (lVar62 = 0; lVar50 != lVar62; lVar62 = lVar62 + 1) {
          bVar9 = puVar74[lVar62];
          bVar10 = *(byte *)((long)&x0 + (ulong)((uint)lVar62 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)lVar62 + 2 & 7)) = bVar9;
          uVar71 = uVar71 + ((uint)bVar9 - (uint)bVar10);
          puVar74[lVar62] = (uchar)(uVar71 >> 1);
        }
        break;
      case 3:
        uVar71 = 0;
        for (lVar62 = 0; lVar50 != lVar62; lVar62 = lVar62 + 1) {
          bVar9 = puVar74[lVar62];
          bVar10 = *(byte *)((long)&x0 + (ulong)((uint)lVar62 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)lVar62 + 3 & 7)) = bVar9;
          uVar71 = uVar71 + ((uint)bVar9 - (uint)bVar10);
          puVar74[lVar62] = (uchar)((ulong)uVar71 / 3);
        }
        break;
      case 4:
        uVar71 = 0;
        for (lVar62 = 0; lVar50 != lVar62; lVar62 = lVar62 + 1) {
          bVar9 = puVar74[lVar62];
          uVar60 = (ulong)((uint)lVar62 & 7);
          *(byte *)((long)&x0 + (uVar60 ^ 4)) = bVar9;
          uVar71 = uVar71 + ((uint)bVar9 - (uint)*(byte *)((long)&x0 + uVar60));
          puVar74[lVar62] = (uchar)(uVar71 >> 2);
        }
        break;
      case 5:
        uVar71 = 0;
        for (lVar62 = 0; lVar50 != lVar62; lVar62 = lVar62 + 1) {
          bVar9 = puVar74[lVar62];
          bVar10 = *(byte *)((long)&x0 + (ulong)((uint)lVar62 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)lVar62 + 5 & 7)) = bVar9;
          uVar71 = uVar71 + ((uint)bVar9 - (uint)bVar10);
          puVar74[lVar62] = (uchar)((ulong)uVar71 / 5);
        }
        break;
      default:
        uVar71 = 0;
        for (lVar62 = 0; lVar50 != lVar62; lVar62 = lVar62 + 1) {
          bVar9 = puVar74[lVar62];
          bVar10 = *(byte *)((long)&x0 + (ulong)((uint)lVar62 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)local_468 + (uint)lVar62 & 7)) = bVar9;
          uVar71 = uVar71 + ((uint)bVar9 - (uint)bVar10);
          puVar74[lVar62] = (uchar)((ulong)uVar71 / ((ulong)local_468 & 0xffffffff));
        }
      }
      for (; lVar37 < iVar34; lVar37 = lVar37 + 1) {
        uVar71 = uVar71 - *(byte *)((long)&x0 + (ulong)((uint)lVar37 & 7));
        *puVar63 = (uchar)(uVar71 / (uint)local_468);
        puVar63 = puVar63 + 1;
      }
      puVar74 = puVar74 + lVar72;
      puVar56 = puVar56 + lVar72;
    }
    iVar70 = psVar57[lVar75].x;
  }
  if (1 < local_458[0]) {
    lVar37 = (long)(psVar57[lVar75].y * local_3f4);
    pbVar69 = puVar40 + lVar37 + iVar70;
    iVar34 = psVar57[lVar75].w;
    iVar35 = psVar57[lVar75].h;
    iVar36 = iVar35 - local_458._0_4_;
    x0 = 0;
    uStack_234 = 0;
    iVar65 = 0;
    if (iVar34 < 1) {
      iVar34 = 0;
    }
    if (iVar36 < 0) {
      iVar36 = -1;
    }
    lVar50 = (long)iVar36 + 1;
    puVar74 = puVar40 + lVar72 * lVar50 + iVar70 + lVar37;
    for (; auVar84 = local_458._0_16_, iVar65 != iVar34; iVar65 = iVar65 + 1) {
      __memset_chk(&x0,0,local_458._0_8_);
      puVar56 = puVar74;
      lVar37 = lVar50;
      switch(auVar84._0_4_) {
      case 2:
        uVar71 = 0;
        pbVar64 = pbVar69;
        for (lVar62 = 0; lVar50 != lVar62; lVar62 = lVar62 + 1) {
          bVar9 = *pbVar64;
          bVar10 = *(byte *)((long)&x0 + (ulong)((uint)lVar62 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)lVar62 + 2 & 7)) = bVar9;
          uVar71 = uVar71 + ((uint)bVar9 - (uint)bVar10);
          *pbVar64 = (byte)(uVar71 >> 1);
          pbVar64 = pbVar64 + lVar72;
        }
        break;
      case 3:
        uVar71 = 0;
        pbVar64 = pbVar69;
        for (lVar62 = 0; lVar50 != lVar62; lVar62 = lVar62 + 1) {
          bVar9 = *pbVar64;
          bVar10 = *(byte *)((long)&x0 + (ulong)((uint)lVar62 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)lVar62 + 3 & 7)) = bVar9;
          uVar71 = uVar71 + ((uint)bVar9 - (uint)bVar10);
          *pbVar64 = (byte)((ulong)uVar71 / 3);
          pbVar64 = pbVar64 + lVar72;
        }
        break;
      case 4:
        uVar71 = 0;
        pbVar64 = pbVar69;
        for (lVar62 = 0; lVar50 != lVar62; lVar62 = lVar62 + 1) {
          bVar9 = *pbVar64;
          uVar60 = (ulong)((uint)lVar62 & 7);
          *(byte *)((long)&x0 + (uVar60 ^ 4)) = bVar9;
          uVar71 = uVar71 + ((uint)bVar9 - (uint)*(byte *)((long)&x0 + uVar60));
          *pbVar64 = (byte)(uVar71 >> 2);
          pbVar64 = pbVar64 + lVar72;
        }
        break;
      case 5:
        uVar71 = 0;
        pbVar64 = pbVar69;
        for (lVar62 = 0; lVar50 != lVar62; lVar62 = lVar62 + 1) {
          bVar9 = *pbVar64;
          bVar10 = *(byte *)((long)&x0 + (ulong)((uint)lVar62 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)lVar62 + 5 & 7)) = bVar9;
          uVar71 = uVar71 + ((uint)bVar9 - (uint)bVar10);
          *pbVar64 = (byte)((ulong)uVar71 / 5);
          pbVar64 = pbVar64 + lVar72;
        }
        break;
      default:
        uVar71 = 0;
        pbVar64 = pbVar69;
        for (lVar62 = 0; lVar50 != lVar62; lVar62 = lVar62 + 1) {
          bVar9 = *pbVar64;
          bVar10 = *(byte *)((long)&x0 + (ulong)((uint)lVar62 & 7));
          *(byte *)((long)&x0 + (ulong)(local_458._0_4_ + (uint)lVar62 & 7)) = bVar9;
          uVar71 = uVar71 + ((uint)bVar9 - (uint)bVar10);
          *pbVar64 = (byte)((ulong)uVar71 / (local_458._0_8_ & 0xffffffff));
          pbVar64 = pbVar64 + lVar72;
        }
      }
      for (; lVar37 < iVar35; lVar37 = lVar37 + 1) {
        uVar71 = uVar71 - *(byte *)((long)&x0 + (ulong)((uint)lVar37 & 7));
        *puVar56 = (uchar)(uVar71 / local_458._0_4_);
        puVar56 = puVar56 + lVar72;
      }
      pbVar69 = pbVar69 + 1;
      puVar74 = puVar74 + 1;
    }
    iVar70 = psVar57[lVar75].x;
  }
  local_2a0->x0 = (unsigned_short)iVar70;
  local_2a0->y0 = (unsigned_short)psVar57[lVar75].y;
  local_2a0->x1 = (short)psVar57[lVar75].w + (short)psVar57[lVar75].x;
  local_2a0->y1 = (short)psVar57[lVar75].h + (short)psVar57[lVar75].y;
  local_2a0->xadvance = (float)(int)(short)((ushort)bVar7 * 0x100 + (ushort)bVar8) * local_278;
  local_2a0->xoff = (float)x0_1 * fVar89 + local_3c4;
  in_XMM4_Db = 0;
  in_XMM4_Dc = 0;
  in_XMM4_Dd = 0;
  local_2a0->yoff = (float)y0_1 * (1.0 / fVar78) + local_3c0;
  local_2a0->xoff2 = (float)(psVar57[lVar75].w + x0_1) * fVar89 + local_3c4;
  local_2a0->yoff2 = (float)(psVar57[lVar75].h + y0_1) * (1.0 / fVar78) + local_3c0;
  uVar54 = uVar54 & 0xffffffff;
  uVar60 = local_300;
  psVar57 = local_310;
  lVar75 = local_2f8;
  if ((int)local_2f0 == 0) {
    uVar54 = local_300 & 0xffffffff;
  }
LAB_001e072c:
  lVar75 = lVar75 + 1;
  uVar60 = uVar60 + 1;
  goto LAB_001df06c;
}

Assistant:

static bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        if (src_tmp.DstIndex == -1)
        {
            IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
            return false;
        }
        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, q.x0 + font_off_x, q.y0 + font_off_y, q.x1 + font_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
        }
    }

    // Cleanup
    src_tmp_array.clear_destruct();

    ImFontAtlasBuildFinish(atlas);
    return true;
}